

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

StringPtr __thiscall kj::HttpHeaders::cloneToOwn(HttpHeaders *this,StringPtr str)

{
  size_t sVar1;
  size_t in_RCX;
  char *pcVar2;
  StringPtr SVar3;
  StringPtr value;
  String copy;
  Array<char> local_58;
  Array<char> local_38;
  
  value.content.ptr = (char *)str.content.size_;
  value.content.size_ = in_RCX;
  heapString((String *)&local_58,(kj *)str.content.ptr,value);
  sVar1 = local_58.size_;
  pcVar2 = local_58.ptr;
  local_38.ptr = local_58.ptr;
  local_38.size_ = local_58.size_;
  local_38.disposer = local_58.disposer;
  local_58.ptr = (char *)0x0;
  local_58.size_ = 0;
  Vector<kj::Array<char>>::add<kj::Array<char>>
            ((Vector<kj::Array<char>> *)&this->ownedStrings,&local_38);
  if (sVar1 == 0) {
    pcVar2 = "";
  }
  Array<char>::~Array(&local_38);
  Array<char>::~Array(&local_58);
  SVar3.content.size_ = sVar1 + (sVar1 == 0);
  SVar3.content.ptr = pcVar2;
  return (StringPtr)SVar3.content;
}

Assistant:

kj::StringPtr HttpHeaders::cloneToOwn(kj::StringPtr str) {
  auto copy = kj::heapString(str);
  kj::StringPtr result = copy;
  ownedStrings.add(copy.releaseArray());
  return result;
}